

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitTableGet(PrintExpressionContents *this,TableGet *curr)

{
  string_view str;
  
  str._M_str = "table.get ";
  str._M_len = 10;
  printMedium(this->o,str);
  Name::print(&curr->table,this->o);
  return;
}

Assistant:

void visitTableGet(TableGet* curr) {
    printMedium(o, "table.get ");
    curr->table.print(o);
  }